

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# preprocessor.cpp
# Opt level: O2

tuple<int,_bool> __thiscall
anon_unknown.dwarf_eaf21::preprocessor<baryonyx::raw_problem>::reduce_greater_constraint
          (preprocessor<baryonyx::raw_problem> *this,constraint *constraint)

{
  int iVar1;
  bool bVar2;
  int result;
  int factor;
  int variable;
  undefined1 local_3c [12];
  undefined1 *local_30;
  int *local_28;
  int *local_20;
  
  reduce((preprocessor<baryonyx::raw_problem> *)local_3c,constraint);
  local_28 = &variable;
  local_20 = &factor;
  local_30 = (undefined1 *)&result;
  std::tuple<int&,int&,int&>::operator=
            ((tuple<int&,int&,int&> *)&local_30,(tuple<int,_int,_int> *)local_3c);
  if (variable < 0) {
    iVar1 = -1;
    bVar2 = false;
  }
  else {
    iVar1 = -1;
    if (factor < result) {
      iVar1 = variable;
    }
    bVar2 = 0 < result;
    if (0 < result) {
      iVar1 = variable;
    }
    if (0 < result && factor < result) {
      baryonyx::details::fail_fast
                ("Reached","cond",
                 "/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/lib/src/preprocessor.cpp"
                 ,"237");
    }
  }
  *(bool *)&this->ctx = bVar2;
  *(int *)((long)&this->ctx + 4) = iVar1;
  return (tuple<int,_bool>)(_Tuple_impl<0UL,_int,_bool>)this;
}

Assistant:

auto reduce_greater_constraint(const bx::constraint& constraint)
      -> std::tuple<int, bool>
    {
        int factor, variable, result;

        std::tie(factor, variable, result) = reduce(constraint);

        if (variable < 0)
            return std::make_tuple(-1, false);

        bool affect_0 = (factor * 0 >= result);
        bool affect_1 = (factor * 1 >= result);

        if (affect_0 && affect_1)
            return std::make_tuple(-1, false);

        if (affect_0)
            return std::make_tuple(variable, false);

        if (affect_1)
            return std::make_tuple(variable, true);

        bx_reach();
    }